

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O0

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::prune_to_min_complement
          (tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
           *this,double *m)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  reference this_00;
  double *in_RSI;
  const_iterator in_RDI;
  double dVar6;
  iterator pos;
  uint row;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff38;
  reference in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 uVar7;
  const_iterator __first;
  uint local_14;
  
  __first._M_current = (double *)*in_RSI;
  dVar6 = tools::min_value<double>();
  if (dVar6 * 4.0 < (double)__first._M_current) {
    local_14 = 0;
    while( true ) {
      sVar2 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)in_RDI._M_current);
      uVar7 = false;
      if (local_14 < sVar2) {
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)in_RDI._M_current,(ulong)local_14);
        sVar2 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
        uVar7 = sVar2 != 0;
      }
      if ((bool)uVar7 == false) break;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)in_RDI._M_current,(ulong)local_14);
      iVar4 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff38);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)in_RDI._M_current,(ulong)local_14);
      iVar5 = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff38);
      std::
      lower_bound<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,boost::math::quadrature::detail::tanh_sinh_detail<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>::prune_to_min_complement(double_const&)::_lambda(double_const&,double_const&)_1_>
                (iVar4._M_current,iVar5._M_current,in_RSI);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)in_RDI._M_current,(ulong)local_14);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff38);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_stack_ffffffffffffff40,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_stack_ffffffffffffff38);
      if (bVar1) {
        in_stack_ffffffffffffff40 =
             std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)in_RDI._M_current,(ulong)local_14);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                    *)in_stack_ffffffffffffff40,
                   (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                   in_stack_ffffffffffffff38);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)in_RDI._M_current,(ulong)local_14);
        std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff38);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                    *)in_stack_ffffffffffffff40,
                   (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                   in_stack_ffffffffffffff38);
        std::vector<double,_std::allocator<double>_>::erase
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(uVar7,in_stack_ffffffffffffff58),__first,in_RDI);
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)((long)in_RDI._M_current + 0x18),(ulong)local_14);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)((long)in_RDI._M_current + 0x18),(ulong)local_14);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff38);
        this_00 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)in_RDI._M_current,(ulong)local_14);
        std::vector<double,_std::allocator<double>_>::size(this_00);
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                  pvVar3,(difference_type)in_stack_ffffffffffffff40);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                    *)in_stack_ffffffffffffff40,
                   (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                   in_stack_ffffffffffffff38);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)((long)in_RDI._M_current + 0x18),(ulong)local_14);
        std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff38);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                    *)in_stack_ffffffffffffff40,
                   (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                   in_stack_ffffffffffffff38);
        std::vector<double,_std::allocator<double>_>::erase
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(uVar7,in_stack_ffffffffffffff58),__first,in_RDI);
      }
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

void tanh_sinh_detail<Real, Policy>::prune_to_min_complement(const Real& m)
{
   //
   // If our tables were constructed from pre-computed data, then they will have more values stored than we can ever use,
   // and although the table size at this stage won't be too large, if we calculate down to m_max_levels then they will
   // grow by a huge amount - doubling in size at each step - so lets prune them down, removing values which will never
   // be used:
   //
   if (m > tools::min_value<Real>() * 4)
   {
      for (unsigned row = 0; (row < m_abscissas.size()) && m_abscissas[row].size(); ++row)
      {
         typename std::vector<Real>::iterator pos = std::lower_bound(m_abscissas[row].begin(), m_abscissas[row].end(), m, [](const Real& a, const Real& b) { using std::fabs; return fabs(a) > fabs(b); });
         if (pos != m_abscissas[row].end())
         {
            m_abscissas[row].erase(pos, m_abscissas[row].end());
            m_weights[row].erase(m_weights[row].begin() + m_abscissas[row].size(), m_weights[row].end());
         }
      }
   }
}